

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O0

TLabel __thiscall Refal2::CModuleBuilder::declare(CModuleBuilder *this,CToken *nameToken)

{
  bool bVar1;
  byte bVar2;
  int index;
  pointer pCVar3;
  unique_ptr *this_00;
  CPreparatoryFunction *this_01;
  CPreparatoryFunctionPtr *function;
  TLabel label;
  string local_38 [8];
  string name;
  CToken *nameToken_local;
  CModuleBuilder *this_local;
  
  bVar1 = isModuleExist(this);
  if (!bVar1) {
    __assert_fail("isModuleExist()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ModuleBuilder.cpp"
                  ,0xf5,"TLabel Refal2::CModuleBuilder::declare(const CToken &)");
  }
  bVar2 = std::__cxx11::string::empty();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!nameToken.word.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ModuleBuilder.cpp"
                  ,0xf6,"TLabel Refal2::CModuleBuilder::declare(const CToken &)");
  }
  std::__cxx11::string::string(local_38,(string *)&nameToken->word);
  MakeLower((string *)local_38);
  pCVar3 = std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>::
           operator->(&this->module);
  index = CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::AddKey(&pCVar3->Functions,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  pCVar3 = std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>::
           operator->(&this->module);
  this_00 = (unique_ptr *)
            CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::GetData(&pCVar3->Functions,index);
  bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
  if (!bVar1) {
    this_01 = (CPreparatoryFunction *)operator_new(0xb8);
    CPreparatoryFunction::CPreparatoryFunction(this_01,nameToken);
    std::
    unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>::
    reset((unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>
           *)this_00,this_01);
  }
  std::__cxx11::string::~string(local_38);
  return index;
}

Assistant:

TLabel CModuleBuilder::declare( const CToken& nameToken )
{
	assert( isModuleExist() );
	assert( !nameToken.word.empty() );
	std::string name = nameToken.word;
	MakeLower( name );
	const TLabel label = module->Functions.AddKey( name );
	CPreparatoryFunctionPtr& function = module->Functions.GetData( label );
	if( !static_cast<bool>( function ) ) {
		function.reset( new CPreparatoryFunction( nameToken ) );
	}
	return label;
}